

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::NeedDyndepForSource
          (cmGeneratorTarget *this,string *lang,string *config,cmSourceFile *sf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer __s1;
  cmGlobalGenerator *pcVar2;
  bool bVar3;
  int iVar4;
  Cxx20SupportLevel CVar5;
  PolicyStatus PVar6;
  cmFileSet *pcVar7;
  cmValue cVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar9;
  size_type __rlen;
  string_view value;
  cmValue tgtProp;
  cmValue sfProp;
  string local_60;
  cmValue local_40;
  cmValue local_38;
  
  __s1 = (lang->_M_dataplus)._M_p;
  if (lang->_M_string_length == 3) {
    iVar4 = bcmp(__s1,"CXX",3);
    if (iVar4 == 0) {
      pcVar7 = GetFileSetForSource(this,config,sf);
      if (((pcVar7 != (cmFileSet *)0x0) && ((pcVar7->Type)._M_string_length == 0xb)) &&
         (iVar4 = bcmp((pcVar7->Type)._M_dataplus._M_p,"CXX_MODULES",0xb), iVar4 == 0)) {
        return true;
      }
      CVar5 = HaveCxxModuleSupport(this,config);
      if (CVar5 < MissingRule) {
        return false;
      }
      pcVar2 = this->LocalGenerator->GlobalGenerator;
      iVar4 = (*pcVar2->_vptr_cmGlobalGenerator[0xe])(pcVar2,1);
      paVar1 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CXX_SCAN_FOR_MODULES","")
      ;
      local_38 = cmSourceFile::GetProperty(sf,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      bVar3 = cmValue::IsSet(&local_38);
      cVar8.Value = local_38.Value;
      pcVar9 = extraout_RDX;
      if (!bVar3) {
        local_60._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"CXX_SCAN_FOR_MODULES","");
        local_40 = GetProperty(this,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        bVar3 = cmValue::IsSet(&local_40);
        cVar8.Value = local_40.Value;
        pcVar9 = extraout_RDX_00;
        if (!bVar3) {
          PVar6 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0155);
          return (bool)(CVar5 != MissingRule & (byte)iVar4 & PVar6 - NEW < 3);
        }
      }
      if (cVar8.Value != (string *)0x0) {
        value._M_str = pcVar9;
        value._M_len = (size_t)((cVar8.Value)->_M_dataplus)._M_p;
        bVar3 = cmValue::IsOn((cmValue *)(cVar8.Value)->_M_string_length,value);
        return bVar3;
      }
    }
  }
  else if ((lang->_M_string_length == 7) && (iVar4 = bcmp(__s1,"Fortran",7), iVar4 == 0)) {
    return true;
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::NeedDyndepForSource(std::string const& lang,
                                            std::string const& config,
                                            cmSourceFile const* sf) const
{
  // Fortran always needs to be scanned.
  if (lang == "Fortran"_s) {
    return true;
  }
  // Only C++ code needs scanned otherwise.
  if (lang != "CXX"_s) {
    return false;
  }

  // Any file in `CXX_MODULES` file sets need scanned (it being `CXX` is
  // enforced elsewhere).
  auto const* fs = this->GetFileSetForSource(config, sf);
  if (fs && fs->GetType() == "CXX_MODULES"_s) {
    return true;
  }

  bool haveRule = false;
  switch (this->HaveCxxModuleSupport(config)) {
    case Cxx20SupportLevel::MissingCxx:
    case Cxx20SupportLevel::NoCxx20:
      return false;
    case Cxx20SupportLevel::MissingRule:
      break;
    case Cxx20SupportLevel::Supported:
      haveRule = true;
      break;
  }
  bool haveGeneratorSupport =
    this->GetGlobalGenerator()->CheckCxxModuleSupport(
      cmGlobalGenerator::CxxModuleSupportQuery::Inspect);
  auto const sfProp = sf->GetProperty("CXX_SCAN_FOR_MODULES");
  if (sfProp.IsSet()) {
    return sfProp.IsOn();
  }
  auto const tgtProp = this->GetProperty("CXX_SCAN_FOR_MODULES");
  if (tgtProp.IsSet()) {
    return tgtProp.IsOn();
  }

  bool policyAnswer = false;
  switch (this->GetPolicyStatusCMP0155()) {
    case cmPolicies::WARN:
    case cmPolicies::OLD:
      // The OLD behavior is to not scan the source.
      policyAnswer = false;
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      // The NEW behavior is to scan the source if the compiler supports
      // scanning and the generator supports it.
      policyAnswer = haveRule && haveGeneratorSupport;
      break;
  }
  return policyAnswer;
}